

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall
TorController::authchallenge_cb
          (TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  long lVar1;
  bool bVar2;
  mapped_type *pmVar3;
  key_type *this_00;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  string_view str;
  Span<const_unsigned_char> s_02;
  Span<const_unsigned_char> s_03;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  _Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
  local_170;
  ReplyHandlerCB local_158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> computedClientHash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> computedServerHash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serverNonce;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serverHash;
  string local_d8;
  key_type local_b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  l;
  Level level;
  size_type sVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code == 0xfa) {
    bVar2 = ::LogAcceptCategory((LogFlags)this,(Level)_conn);
    if (bVar2) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "authchallenge_cb";
      logging_function._M_len = 0x10;
      ::LogPrintf_<>(logging_function,source_file,0x1fd,TOR,Debug,
                     "SAFECOOKIE authentication challenge successful\n");
    }
    SplitTorReplyLine(&l,(reply->lines).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
    bVar2 = std::operator==(&l.first,"AUTHCHALLENGE");
    if (bVar2) {
      ParseTorReplyMapping(&m,&l.second);
      if (m._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        str._M_str = l.second._M_dataplus._M_p;
        str._M_len = l.second._M_string_length;
        SanitizeString_abi_cxx11_(&local_b8,str,0);
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_03._M_len = 0x57;
        logging_function_03._M_str = "authchallenge_cb";
        logging_function_03._M_len = 0x10;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_03,source_file_03,0x202,ALL,Info,
                   "tor: Error parsing AUTHCHALLENGE parameters: %s\n",&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"SERVERHASH",(allocator<char> *)&local_d8);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&m,&local_b8);
        hex_str._M_str = (pmVar3->_M_dataplus)._M_p;
        hex_str._M_len = pmVar3->_M_string_length;
        ParseHex<unsigned_char>(&serverHash,hex_str);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"SERVERNONCE",(allocator<char> *)&local_d8);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&m,&local_b8);
        sVar4 = pmVar3->_M_string_length;
        hex_str_00._M_str = (pmVar3->_M_dataplus)._M_p;
        hex_str_00._M_len = sVar4;
        ParseHex<unsigned_char>(&serverNonce,hex_str_00);
        level = (Level)sVar4;
        this_00 = &local_b8;
        std::__cxx11::string::~string((string *)this_00);
        bVar2 = ::LogAcceptCategory((LogFlags)this_00,level);
        if (bVar2) {
          s.m_size = (long)serverHash.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)serverHash.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
          s.m_data = serverHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_(&local_b8,s);
          s_00.m_size = (long)serverNonce.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)serverNonce.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
          s_00.m_data = serverNonce.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_(&local_d8,s_00);
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file_00._M_len = 0x57;
          logging_function_00._M_str = "authchallenge_cb";
          logging_function_00._M_len = 0x10;
          LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                    (logging_function_00,source_file_00,0x207,TOR,Debug,
                     "AUTHCHALLENGE ServerHash %s ServerNonce %s\n",&local_b8,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        if ((long)serverNonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)serverNonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0x20) {
          ComputeResponse(&computedServerHash,&TOR_SAFE_SERVERKEY_abi_cxx11_,&this->cookie,
                          &this->clientNonce,&serverNonce);
          bVar2 = std::operator==(&computedServerHash,&serverHash);
          if (bVar2) {
            ComputeResponse(&computedClientHash,&TOR_SAFE_CLIENTKEY_abi_cxx11_,&this->cookie,
                            &this->clientNonce,&serverNonce);
            s_01.m_size = (long)computedClientHash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)computedClientHash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
            s_01.m_data = computedClientHash.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            HexStr_abi_cxx11_(&local_d8,s_01);
            std::operator+(&local_b8,"AUTHENTICATE ",&local_d8);
            local_170._M_f = (offset_in_TorController_to_subr)auth_cb;
            local_170._8_8_ = 0;
            local_170._M_bound_args.
            super__Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
            super__Head_base<0UL,_TorController_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
                 (_Tuple_impl<0UL,_TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
                 this;
            std::function<void(TorControlConnection&,TorControlReply_const&)>::
            function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                      ((function<void(TorControlConnection&,TorControlReply_const&)> *)&local_158,
                       &local_170);
            TorControlConnection::Command(_conn,&local_b8,&local_158);
            std::_Function_base::~_Function_base(&local_158.super__Function_base);
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&computedClientHash.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          }
          else {
            s_02.m_size = (long)serverHash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)serverHash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
            s_02.m_data = serverHash.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            HexStr_abi_cxx11_(&local_b8,s_02);
            s_03.m_size = (long)computedServerHash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)computedServerHash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
            s_03.m_data = computedServerHash.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            HexStr_abi_cxx11_(&local_d8,s_03);
            source_file_05._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
            ;
            source_file_05._M_len = 0x57;
            logging_function_05._M_str = "authchallenge_cb";
            logging_function_05._M_len = 0x10;
            LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_05,source_file_05,0x20f,ALL,Info,
                       "tor: ServerHash %s does not match expected ServerHash %s\n",&local_b8,
                       &local_d8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_b8);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&computedServerHash.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        else {
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file_04._M_len = 0x57;
          logging_function_04._M_str = "authchallenge_cb";
          logging_function_04._M_len = 0x10;
          ::LogPrintf_<>(logging_function_04,source_file_04,0x209,ALL,Info,
                         "tor: ServerNonce is not 32 bytes, as required by spec\n");
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&serverNonce.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&serverHash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&m._M_t);
    }
    else {
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_02._M_len = 0x57;
      logging_function_02._M_str = "authchallenge_cb";
      logging_function_02._M_len = 0x10;
      ::LogPrintf_<>(logging_function_02,source_file_02,0x216,ALL,Info,
                     "tor: Invalid reply to AUTHCHALLENGE\n");
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&l);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_0089253e:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_0089253e;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_01._M_len = 0x57;
    logging_function_01._M_str = "authchallenge_cb";
    logging_function_01._M_len = 0x10;
    ::LogPrintf_<>(logging_function_01,source_file_01,0x219,ALL,Info,
                   "tor: SAFECOOKIE authentication challenge failed\n");
  }
  return;
}

Assistant:

void TorController::authchallenge_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        LogDebug(BCLog::TOR, "SAFECOOKIE authentication challenge successful\n");
        std::pair<std::string,std::string> l = SplitTorReplyLine(reply.lines[0]);
        if (l.first == "AUTHCHALLENGE") {
            std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
            if (m.empty()) {
                LogPrintf("tor: Error parsing AUTHCHALLENGE parameters: %s\n", SanitizeString(l.second));
                return;
            }
            std::vector<uint8_t> serverHash = ParseHex(m["SERVERHASH"]);
            std::vector<uint8_t> serverNonce = ParseHex(m["SERVERNONCE"]);
            LogDebug(BCLog::TOR, "AUTHCHALLENGE ServerHash %s ServerNonce %s\n", HexStr(serverHash), HexStr(serverNonce));
            if (serverNonce.size() != 32) {
                LogPrintf("tor: ServerNonce is not 32 bytes, as required by spec\n");
                return;
            }

            std::vector<uint8_t> computedServerHash = ComputeResponse(TOR_SAFE_SERVERKEY, cookie, clientNonce, serverNonce);
            if (computedServerHash != serverHash) {
                LogPrintf("tor: ServerHash %s does not match expected ServerHash %s\n", HexStr(serverHash), HexStr(computedServerHash));
                return;
            }

            std::vector<uint8_t> computedClientHash = ComputeResponse(TOR_SAFE_CLIENTKEY, cookie, clientNonce, serverNonce);
            _conn.Command("AUTHENTICATE " + HexStr(computedClientHash), std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
        } else {
            LogPrintf("tor: Invalid reply to AUTHCHALLENGE\n");
        }
    } else {
        LogPrintf("tor: SAFECOOKIE authentication challenge failed\n");
    }
}